

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peephole.cpp
# Opt level: O1

Module * mocker::runPeepholeOptimization(Module *__return_storage_ptr__,Module *module)

{
  shared_ptr<mocker::nasm::Inst> *v;
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  size_t __n;
  key_type *pkVar4;
  size_type sVar5;
  _func_int **__n_00;
  _Alloc_hider _Var6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  long lVar8;
  int iVar9;
  Register *__tmp_1;
  iterator iVar10;
  undefined8 *puVar11;
  Inst *__tmp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  Inst *__tmp;
  long *plVar13;
  long *plVar14;
  key_type *pkVar15;
  key_type *pkVar16;
  key_type *pkVar17;
  bool bVar18;
  bool bVar19;
  shared_ptr<mocker::nasm::Register> rDest;
  shared_ptr<mocker::nasm::BinaryInst> incDec;
  shared_ptr<mocker::nasm::NumericConstant> lit;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Register> dest;
  shared_ptr<mocker::nasm::Inst> local_d8;
  key_type local_c8;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  long local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  key_type *local_60;
  Module *local_58;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
  local_48;
  shared_ptr<mocker::nasm::Addr> local_40;
  
  nasm::Module::Module(__return_storage_ptr__,module);
  paVar2 = &local_c8.field_2;
  local_c8.field_2._M_allocated_capacity._0_6_ = 0x747865742e;
  local_c8._M_string_length = 5;
  local_50 = &(__return_storage_ptr__->sections)._M_h;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  local_58 = __return_storage_ptr__;
  iVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(local_50,&local_c8);
  if (iVar10.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  plVar13 = (long *)((long)iVar10.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                           ._M_cur + 0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  plVar14 = (long *)*plVar13;
  if (plVar14 != plVar13) {
    do {
      if (plVar14[6] != 0) {
        nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>&>
                  ((nasm *)&local_c8,(shared_ptr<mocker::nasm::Inst> *)(plVar14 + 6));
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c8._M_dataplus._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) && (iVar9 = *(int *)(local_c8._M_dataplus._M_p + 8), 0xfffffffd < iVar9 - 5U))
        {
          nasm::dyc<mocker::nasm::NumericConstant,std::shared_ptr<mocker::nasm::Addr>const&>
                    ((nasm *)&local_a8,
                     (shared_ptr<mocker::nasm::Addr> *)(local_c8._M_dataplus._M_p + 0x20));
          if ((local_a8 != (element_type *)0x0) && (local_a8[1]._vptr_Inst == (_func_int **)0x1)) {
            nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
                      ((nasm *)&local_88,
                       (shared_ptr<mocker::nasm::Addr> *)(local_c8._M_dataplus._M_p + 0x10));
            puVar11 = (undefined8 *)operator_new(0x30);
            p_Var12 = p_Stack_80;
            lVar8 = local_88;
            puVar11[1] = 0x100000001;
            *puVar11 = &PTR___Sp_counted_ptr_inplace_001f08d0;
            local_88 = 0;
            p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            puVar11[2] = &PTR__UnaryInst_001f0920;
            *(uint *)(puVar11 + 3) = iVar9 == 3 ^ 3;
            puVar11[4] = lVar8;
            puVar11[5] = p_Var12;
            plVar14[6] = (long)(puVar11 + 2);
            p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar14[7];
            plVar14[7] = (long)puVar11;
            if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
            }
            if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
            }
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
        }
      }
      plVar14 = (long *)*plVar14;
    } while (plVar14 != plVar13);
  }
  local_c8.field_2._M_allocated_capacity._0_6_ = 0x747865742e;
  local_c8._M_string_length = 5;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  local_48._M_cur =
       (__node_type *)
       std::
       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
       ::find(local_50,&local_c8);
  if (local_48._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_60 = (key_type *)((long)local_48._M_cur + 0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pkVar15 = (key_type *)(local_60->_M_dataplus)._M_p;
  pkVar16 = local_60;
  if (pkVar15 != local_60) {
    do {
      if (pkVar15[1].field_2._M_allocated_capacity != 0) {
        nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>&>
                  ((nasm *)&local_a8,(shared_ptr<mocker::nasm::Inst> *)&pkVar15[1].field_2);
        if (local_a8 != (element_type *)0x0) {
          local_c8._M_dataplus._M_p = (pointer)local_a8[1]._vptr_Inst;
          local_c8._M_string_length = (size_type)local_a8[2]._vptr_Inst;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_c8._M_string_length)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_c8._M_string_length)->_M_use_count + 1;
            }
          }
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                    ((nasm *)&local_88,(shared_ptr<mocker::nasm::Addr> *)&local_c8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
          }
          if (local_88 != 0) {
            local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_a8;
            local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = local_a0;
            if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_a0->_M_use_count = local_a0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_a0->_M_use_count = local_a0->_M_use_count + 1;
              }
            }
            nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               *)&local_c8,&local_d8);
            if (local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            lVar8 = local_88;
            sVar5 = local_c8._M_string_length;
            if (local_c8._M_dataplus._M_p == (pointer)local_c8._M_string_length) {
LAB_0012fd63:
              pkVar4 = (key_type *)(pkVar16->_M_dataplus)._M_p;
              pkVar17 = pkVar15;
              if (pkVar15 != pkVar4) {
                while (sVar5 = pkVar17->_M_string_length, *(long *)(sVar5 + 0x30) != 0) {
                  v = (shared_ptr<mocker::nasm::Inst> *)(sVar5 + 0x30);
                  local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)0x0;
                  local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>&>
                            ((nasm *)&local_98,v);
                  if (local_98 != 0) {
                    local_40.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = *(element_type **)(local_98 + 8);
                    local_40.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 0x10);
                    if (local_40.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_40.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_40.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_40.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_use_count =
                             (local_40.
                              super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                              ((nasm *)&local_78,&local_40);
                    p_Var12 = p_Stack_70;
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = local_78;
                    _Var7._M_pi = local_d8.
                                  super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                    local_78 = (element_type *)0x0;
                    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = p_Var12;
                    if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
                    }
                    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
                    }
                    if (local_40.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_40.
                                 super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                  }
                  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
                  }
                  nasm::dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>&>
                            ((nasm *)&local_98,v);
                  if (local_98 != 0) {
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = *(element_type **)(local_98 + 0x10);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                              (&local_d8.
                                super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,
                               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 0x18));
                  }
                  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
                  }
                  nasm::dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>&>
                            ((nasm *)&local_98,v);
                  if (local_98 != 0) {
                    nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const&>
                              ((nasm *)&local_78,(shared_ptr<mocker::nasm::Addr> *)(local_98 + 0x10)
                              );
                    p_Var12 = p_Stack_70;
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = local_78;
                    _Var7._M_pi = local_d8.
                                  super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                    local_78 = (element_type *)0x0;
                    p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = p_Var12;
                    if (_Var7._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
                    }
                    if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
                    }
                  }
                  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
                  }
                  nasm::dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>&>
                            ((nasm *)&local_98,v);
                  pkVar16 = local_60;
                  _Var7._M_pi = local_d8.
                                super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                  if (local_98 != 0) {
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = *(element_type **)(local_98 + 8);
                    if (local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr == (element_type *)0x0) {
                      local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr = (element_type *)0x0;
                      p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    }
                    else {
                      p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98 + 0x10);
                      if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var12->_M_use_count = p_Var12->_M_use_count + 1;
                        }
                      }
                    }
                    bVar19 = local_d8.
                             super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi !=
                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = p_Var12;
                    if (bVar19) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var7._M_pi);
                    }
                  }
                  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
                  }
                  if (((local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr == (element_type *)0x0) ||
                      (__n_00 = local_d8.
                                super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr[2]._vptr_Inst, __n_00 != *(_func_int ***)(local_88 + 0x10)))
                     || ((__n_00 != (_func_int **)0x0 &&
                         (iVar9 = bcmp(local_d8.
                                       super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr[1]._vptr_Inst,*(void **)(local_88 + 8),(size_t)__n_00
                                      ), iVar9 != 0)))) {
                    if (local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_d8.
                                 super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    break;
                  }
                  puVar11 = (undefined8 *)operator_new(0x18);
                  puVar11[1] = 0x100000001;
                  *puVar11 = &PTR___Sp_counted_ptr_inplace_001f0c10;
                  puVar11[2] = &PTR__Inst_001f0c60;
                  *(undefined8 **)(sVar5 + 0x30) = puVar11 + 2;
                  p_Var12 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(sVar5 + 0x38);
                  *(undefined8 **)(sVar5 + 0x38) = puVar11;
                  if (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var12);
                  }
                  if (local_d8.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_d8.
                               super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  psVar1 = &pkVar17->_M_string_length;
                  pkVar17 = (key_type *)*psVar1;
                  if ((key_type *)*psVar1 == pkVar4) break;
                }
              }
            }
            else {
              sVar3 = *(size_t *)(local_88 + 0x10);
              bVar19 = true;
              _Var6._M_p = local_c8._M_dataplus._M_p;
              do {
                p_Var12 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)_Var6._M_p + 0x10);
                __n = *(size_t *)
                       (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var6._M_p)->
                             _vptr__Sp_counted_base)->_M_allocated_capacity + 0x10);
                if (__n == sVar3) {
                  if (__n == 0) {
                    bVar18 = true;
                  }
                  else {
                    iVar9 = bcmp(*(void **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                              *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                                 _Var6._M_p)->_vptr__Sp_counted_base)->
                                            _M_allocated_capacity + 8),*(void **)(lVar8 + 8),__n);
                    bVar18 = iVar9 == 0;
                  }
                }
                else {
                  bVar18 = false;
                }
                if (bVar18) {
                  bVar19 = false;
                  break;
                }
                _Var6._M_p = (pointer)p_Var12;
              } while (p_Var12 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5);
              pkVar16 = local_60;
              if (bVar19) goto LAB_0012fd63;
            }
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       *)&local_c8);
          }
          if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
          }
        }
        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
        }
      }
      pkVar15 = (key_type *)(pkVar15->_M_dataplus)._M_p;
    } while (pkVar15 != pkVar16);
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8;
  local_c8.field_2._M_allocated_capacity = 0;
  pkVar15 = (key_type *)(pkVar16->_M_dataplus)._M_p;
  local_c8._M_string_length = (size_type)local_c8._M_dataplus._M_p;
  if (pkVar15 != pkVar16) {
    do {
      pkVar4 = (key_type *)(pkVar15->_M_dataplus)._M_p;
      if (*(long *)((long)&pkVar15->field_2 + 8) == 0) {
        nasm::dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((nasm *)&local_a8,(shared_ptr<mocker::nasm::Inst> *)&pkVar15[1].field_2);
        bVar19 = local_a8 != (element_type *)0x0;
        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
        }
      }
      else {
        bVar19 = false;
      }
      if ((bVar19) &&
         ((key_type *)(pkVar15->_M_dataplus)._M_p != (key_type *)local_c8._M_dataplus._M_p &&
          (key_type *)local_c8._M_dataplus._M_p != pkVar15)) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_c8._M_dataplus._M_p,(_List_node_base *)pkVar15);
        local_c8.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity + 1;
        plVar13 = (long *)((long)&((local_48._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>
                                  ._M_storage._M_storage + 0x50);
        *plVar13 = *plVar13 + -1;
      }
      pkVar15 = pkVar4;
    } while (pkVar4 != pkVar16);
  }
  std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
            ((_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> *)&local_c8);
  return local_58;
}

Assistant:

nasm::Module runPeepholeOptimization(const nasm::Module &module) {
  auto res = module;
  useIncDec(res);
  removeUnusedValue(res);
  return res;
}